

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_ech_encode_config
              (ptls_buffer_t *buf,uint8_t config_id,ptls_hpke_kem_t *kem,ptls_iovec_t public_key,
              ptls_hpke_cipher_suite_t **ciphers,uint8_t max_name_length,char *public_name)

{
  ushort uVar1;
  uint8_t *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  size_t len;
  ptls_hpke_cipher_suite_t *ppVar7;
  int iVar8;
  long lVar9;
  size_t sVar10;
  ptls_hpke_cipher_suite_t **pppVar11;
  size_t sVar12;
  
  iVar4 = ptls_buffer_reserve_aligned(buf,2,'\0');
  if (iVar4 == 0) {
    puVar2 = buf->base;
    sVar10 = buf->off;
    (puVar2 + sVar10)[0] = 0xfe;
    (puVar2 + sVar10)[1] = '\r';
    buf->off = buf->off + 2;
    iVar4 = 0;
  }
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = ptls_buffer_reserve_aligned(buf,2,'\0');
  if (iVar4 == 0) {
    puVar2 = buf->base;
    sVar10 = buf->off;
    (puVar2 + sVar10)[0] = '\0';
    (puVar2 + sVar10)[1] = '\0';
    buf->off = buf->off + 2;
    iVar4 = 0;
  }
  if (iVar4 != 0) {
    return iVar4;
  }
  sVar10 = buf->off;
  iVar4 = ptls_buffer_reserve_aligned(buf,1,'\0');
  if (iVar4 == 0) {
    buf->base[buf->off] = config_id;
    buf->off = buf->off + 1;
    iVar4 = 0;
  }
  if (iVar4 != 0) {
    return iVar4;
  }
  uVar1 = kem->id;
  iVar4 = ptls_buffer_reserve_aligned(buf,2,'\0');
  if (iVar4 == 0) {
    *(ushort *)(buf->base + buf->off) = uVar1 << 8 | uVar1 >> 8;
    buf->off = buf->off + 2;
    iVar4 = 0;
  }
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = ptls_buffer_reserve_aligned(buf,2,'\0');
  if (iVar4 == 0) {
    puVar2 = buf->base;
    sVar12 = buf->off;
    (puVar2 + sVar12)[0] = '\0';
    (puVar2 + sVar12)[1] = '\0';
    buf->off = buf->off + 2;
    iVar4 = 0;
  }
  if (iVar4 == 0) {
    sVar12 = buf->off;
    iVar4 = ptls_buffer__do_pushv(buf,public_key.base,public_key.len);
    if (iVar4 != 0) goto LAB_0011fcdc;
    uVar6 = buf->off - sVar12;
    if (0xffff < uVar6) {
      iVar4 = 0x20c;
      goto LAB_0011fcdc;
    }
    lVar9 = 8;
    do {
      buf->base[sVar12 - 2] = (uint8_t)(uVar6 >> ((byte)lVar9 & 0x3f));
      lVar9 = lVar9 + -8;
      sVar12 = sVar12 + 1;
    } while (lVar9 != -8);
    iVar4 = 0;
    bVar3 = true;
  }
  else {
LAB_0011fcdc:
    bVar3 = false;
  }
  if (!bVar3) {
    return iVar4;
  }
  iVar4 = ptls_buffer_reserve_aligned(buf,2,'\0');
  if (iVar4 == 0) {
    puVar2 = buf->base;
    sVar12 = buf->off;
    (puVar2 + sVar12)[0] = '\0';
    (puVar2 + sVar12)[1] = '\0';
    buf->off = buf->off + 2;
    iVar4 = 0;
  }
  bVar3 = false;
  if (iVar4 == 0) {
    sVar12 = buf->off;
    ppVar7 = *ciphers;
    bVar3 = true;
    if (ppVar7 == (ptls_hpke_cipher_suite_t *)0x0) {
      iVar4 = 0;
    }
    else {
      pppVar11 = ciphers + 1;
      do {
        uVar1 = (ppVar7->id).kdf;
        iVar4 = ptls_buffer_reserve_aligned(buf,2,'\0');
        if (iVar4 == 0) {
          *(ushort *)(buf->base + buf->off) = uVar1 << 8 | uVar1 >> 8;
          buf->off = buf->off + 2;
          iVar4 = 0;
        }
        if (iVar4 != 0) {
LAB_0011fda7:
          bVar3 = false;
          break;
        }
        uVar1 = (pppVar11[-1]->id).aead;
        iVar4 = ptls_buffer_reserve_aligned(buf,2,'\0');
        if (iVar4 == 0) {
          *(ushort *)(buf->base + buf->off) = uVar1 << 8 | uVar1 >> 8;
          buf->off = buf->off + 2;
          iVar4 = 0;
        }
        if (iVar4 != 0) goto LAB_0011fda7;
        ppVar7 = *pppVar11;
        pppVar11 = pppVar11 + 1;
      } while (ppVar7 != (ptls_hpke_cipher_suite_t *)0x0);
    }
    if (bVar3) {
      uVar6 = buf->off - sVar12;
      if (uVar6 < 0x10000) {
        lVar9 = 8;
        do {
          buf->base[sVar12 - 2] = (uint8_t)(uVar6 >> ((byte)lVar9 & 0x3f));
          lVar9 = lVar9 + -8;
          sVar12 = sVar12 + 1;
        } while (lVar9 != -8);
        bVar3 = true;
        goto LAB_0011fe16;
      }
      iVar4 = 0x20c;
    }
    bVar3 = false;
  }
LAB_0011fe16:
  if (!bVar3) {
    return iVar4;
  }
  iVar4 = ptls_buffer_reserve_aligned(buf,1,'\0');
  if (iVar4 == 0) {
    buf->base[buf->off] = max_name_length;
    buf->off = buf->off + 1;
    iVar4 = 0;
  }
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = ptls_buffer_reserve_aligned(buf,1,'\0');
  if (iVar4 == 0) {
    buf->base[buf->off] = '\0';
    buf->off = buf->off + 1;
    iVar4 = 0;
  }
  if (iVar4 == 0) {
    sVar12 = buf->off;
    len = strlen(public_name);
    iVar4 = ptls_buffer__do_pushv(buf,public_name,len);
    if (iVar4 == 0) {
      uVar6 = buf->off - sVar12;
      iVar4 = 0;
      if (uVar6 < 0x100) {
        buf->base[sVar12 - 1] = (uint8_t)uVar6;
        bVar3 = true;
        goto LAB_0011feb5;
      }
      iVar4 = 0x20c;
    }
  }
  bVar3 = false;
LAB_0011feb5:
  if (bVar3) {
    iVar5 = ptls_buffer_reserve_aligned(buf,2,'\0');
    if (iVar5 == 0) {
      puVar2 = buf->base;
      sVar12 = buf->off;
      (puVar2 + sVar12)[0] = '\0';
      (puVar2 + sVar12)[1] = '\0';
      buf->off = buf->off + 2;
      iVar5 = 0;
    }
    iVar8 = iVar5;
    if (iVar5 == 0) {
      sVar12 = buf->off;
      lVar9 = -2;
      do {
        buf->base[lVar9 + sVar12] = '\0';
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0);
      iVar8 = 0;
    }
    iVar4 = iVar8;
    if (iVar5 == 0) {
      uVar6 = buf->off - sVar10;
      iVar4 = 0x20c;
      if (uVar6 < 0x10000) {
        lVar9 = 8;
        do {
          buf->base[sVar10 - 2] = (uint8_t)(uVar6 >> ((byte)lVar9 & 0x3f));
          lVar9 = lVar9 + -8;
          sVar10 = sVar10 + 1;
          iVar4 = iVar8;
        } while (lVar9 != -8);
      }
    }
  }
  return iVar4;
}

Assistant:

int ptls_ech_encode_config(ptls_buffer_t *buf, uint8_t config_id, ptls_hpke_kem_t *kem, ptls_iovec_t public_key,
                           ptls_hpke_cipher_suite_t **ciphers, uint8_t max_name_length, const char *public_name)
{
    int ret;

    ptls_buffer_push16(buf, PTLS_ECH_CONFIG_VERSION);
    ptls_buffer_push_block(buf, 2, {
        ptls_buffer_push(buf, config_id);
        ptls_buffer_push16(buf, kem->id);
        ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, public_key.base, public_key.len); });
        ptls_buffer_push_block(buf, 2, {
            for (size_t i = 0; ciphers[i] != NULL; ++i) {
                ptls_buffer_push16(buf, ciphers[i]->id.kdf);
                ptls_buffer_push16(buf, ciphers[i]->id.aead);
            }
        });
        ptls_buffer_push(buf, max_name_length);
        ptls_buffer_push_block(buf, 1, { ptls_buffer_pushv(buf, public_name, strlen(public_name)); });
        ptls_buffer_push_block(buf, 2, {/* extensions */});
    });

Exit:
    return ret;
}